

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_import.cpp
# Opt level: O0

void __thiscall
UnitsImport_noNameAttribute_Test::~UnitsImport_noNameAttribute_Test
          (UnitsImport_noNameAttribute_Test *this)

{
  UnitsImport_noNameAttribute_Test *this_local;
  
  ~UnitsImport_noNameAttribute_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnitsImport, noNameAttribute)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"http://someplace.world/cellml/model.xml\">\n"
        "    <units units_ref=\"per_mole\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();

    libcellml::ModelPtr m = p->parseModel(in);

    EXPECT_EQ(size_t(1), p->errorCount());
    EXPECT_EQ("Import of units does not specify a name attribute.", p->error(0)->description());
}